

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  uint i;
  long lVar5;
  
  if (num != 0) {
    pvVar4 = (void *)((ulong)num * 0x30 + (long)pSrc_void);
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)pDst_void + lVar5 * 4) = *(undefined4 *)((long)pSrc_void + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      *(undefined4 *)((long)pDst_void + 0x27) = *(undefined4 *)((long)pSrc_void + 0x27);
      uVar1 = *(undefined8 *)((long)pSrc_void + 8);
      uVar2 = *(undefined8 *)((long)pSrc_void + 0x10);
      uVar3 = *(undefined8 *)((long)pSrc_void + 0x20);
      *(undefined8 *)((long)pDst_void + 0x18) = *(undefined8 *)((long)pSrc_void + 0x18);
      *(undefined8 *)((long)pDst_void + 0x20) = uVar3;
      *(undefined8 *)((long)pDst_void + 8) = uVar1;
      *(undefined8 *)((long)pDst_void + 0x10) = uVar2;
      pSrc_void = (void *)((long)pSrc_void + 0x30);
      pDst_void = (void *)((long)pDst_void + 0x30);
    } while (pSrc_void != pvVar4);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }